

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

UnionInvalidReason
duckdb::UnionVector::CheckUnionValidity(Vector *vector_p,idx_t count,SelectionVector *sel_p)

{
  sel_t *psVar1;
  bool bVar2;
  SelectionVector *sel;
  idx_t iVar3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference this_00;
  type this_01;
  reference pvVar4;
  ulong uVar5;
  undefined7 extraout_var;
  UnionInvalidReason UVar6;
  idx_t __n;
  char cVar7;
  idx_t entry_idx;
  ulong uVar8;
  SelectionVector owned_sel;
  vector<duckdb::UnifiedVectorFormat,_true> child_vdata;
  UnifiedVectorFormat vector_vdata;
  allocator_type local_e9;
  ulong local_e8;
  SelectionVector *local_e0;
  reference local_d8;
  ulong local_d0;
  SelectionVector local_c8;
  TemplatedValidityMask<unsigned_long> *local_b0;
  ulong local_a8;
  vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_> local_a0;
  __shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> local_88;
  UnifiedVectorFormat local_78;
  
  local_c8.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8.sel_vector = (sel_t *)0x0;
  local_c8.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_e8 = count;
  if (vector_p->vector_type == CONSTANT_VECTOR) {
    local_e0 = ConstantVector::ZeroSelectionVector(count,&local_c8);
  }
  else {
    local_e0 = sel_p;
    if (vector_p->vector_type == DICTIONARY_VECTOR) {
      DictionaryVector::Child(vector_p);
      sel = DictionaryVector::SelVector(vector_p);
      SelectionVector::Slice((SelectionVector *)&local_78,sel,(idx_t)sel_p);
      ::std::__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_88,
                 (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
      local_e0 = &local_c8;
      SelectionVector::Initialize(local_e0,(buffer_ptr<SelectionData> *)&local_88);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.data);
    }
  }
  iVar3 = UnionType::GetMemberCount(&vector_p->type);
  if (iVar3 == 0) {
    UVar6 = NO_MEMBERS;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector_p,local_e8,&local_78);
    this = StructVector::GetEntries(vector_p);
    ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::vector
              (&local_a0,
               (long)(this->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,&local_e9);
    for (uVar8 = 0;
        uVar8 < (ulong)((long)(this->
                              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->
                              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
      this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::get<true>(this,uVar8);
      this_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this_00);
      pvVar4 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>
                         ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_a0,uVar8);
      Vector::ToUnifiedFormat(this_01,local_e8,pvVar4);
    }
    local_d8 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>
                         ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_a0,0);
    local_b0 = &(local_d8->validity).super_TemplatedValidityMask<unsigned_long>;
    for (uVar8 = 0; uVar8 != local_e8; uVar8 = uVar8 + 1) {
      uVar5 = uVar8;
      if (local_e0->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)local_e0->sel_vector[uVar8];
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6] >>
           (uVar5 & 0x3f) & 1) != 0)) {
        uVar5 = uVar8;
        if (sel_p->sel_vector != (sel_t *)0x0) {
          uVar5 = (ulong)sel_p->sel_vector[uVar8];
        }
        psVar1 = local_d8->sel->sel_vector;
        if (psVar1 != (sel_t *)0x0) {
          uVar5 = (ulong)psVar1[uVar5];
        }
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(local_b0,uVar5);
        if (bVar2) {
          if (local_d8->data[uVar5] < iVar3) {
            local_a8 = (ulong)(byte)(local_d8->data[uVar5] + 1);
            local_d0 = 0;
            __n = 0;
            while( true ) {
              cVar7 = (char)local_a8 - (char)__n;
              do {
                if (iVar3 == __n) goto LAB_012bca1d;
                __n = __n + 1;
                pvVar4 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>
                                   ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_a0,__n);
                uVar5 = uVar8;
                if (sel_p->sel_vector != (sel_t *)0x0) {
                  uVar5 = (ulong)sel_p->sel_vector[uVar8];
                }
                psVar1 = pvVar4->sel->sel_vector;
                if (psVar1 != (sel_t *)0x0) {
                  uVar5 = (ulong)psVar1[uVar5];
                }
                bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                  (&(pvVar4->validity).super_TemplatedValidityMask<unsigned_long>,
                                   uVar5);
                cVar7 = cVar7 + -1;
              } while (!bVar2);
              if ((local_d0 & 1) != 0) break;
              local_d0 = CONCAT71(extraout_var,1);
              if (cVar7 != '\0') {
                UVar6 = TAG_MISMATCH;
                goto LAB_012bca3b;
              }
            }
            UVar6 = VALIDITY_OVERLAP;
          }
          else {
            UVar6 = TAG_OUT_OF_RANGE;
          }
        }
        else {
          UVar6 = NULL_TAG;
        }
        goto LAB_012bca3b;
      }
LAB_012bca1d:
    }
    UVar6 = VALID;
LAB_012bca3b:
    ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::
    ~vector(&local_a0);
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return UVar6;
}

Assistant:

UnionInvalidReason UnionVector::CheckUnionValidity(Vector &vector_p, idx_t count, const SelectionVector &sel_p) {
	D_ASSERT(vector_p.GetType().id() == LogicalTypeId::UNION);

	// Will contain the (possibly) merged selection vector
	const SelectionVector *sel = &sel_p;
	SelectionVector owned_sel;
	Vector *vector = &vector_p;
	if (vector->GetVectorType() == VectorType::DICTIONARY_VECTOR) {
		// In the case of a dictionary vector, unwrap the Vector, and merge the selection vectors.
		auto &child = DictionaryVector::Child(*vector);
		D_ASSERT(child.GetVectorType() != VectorType::DICTIONARY_VECTOR);
		auto &dict_sel = DictionaryVector::SelVector(*vector);
		// merge the selection vectors and verify the child
		auto new_buffer = dict_sel.Slice(*sel, count);
		owned_sel.Initialize(new_buffer);
		sel = &owned_sel;
		vector = &child;
	} else if (vector->GetVectorType() == VectorType::CONSTANT_VECTOR) {
		sel = ConstantVector::ZeroSelectionVector(count, owned_sel);
	}

	auto member_count = UnionType::GetMemberCount(vector_p.GetType());
	if (member_count == 0) {
		return UnionInvalidReason::NO_MEMBERS;
	}

	UnifiedVectorFormat vector_vdata;
	vector_p.ToUnifiedFormat(count, vector_vdata);

	auto &entries = StructVector::GetEntries(vector_p);
	duckdb::vector<UnifiedVectorFormat> child_vdata(entries.size());
	for (idx_t entry_idx = 0; entry_idx < entries.size(); entry_idx++) {
		auto &child = *entries[entry_idx];
		child.ToUnifiedFormat(count, child_vdata[entry_idx]);
	}

	auto &tag_vdata = child_vdata[0];

	for (idx_t row_idx = 0; row_idx < count; row_idx++) {
		auto mapped_idx = sel->get_index(row_idx);

		if (!vector_vdata.validity.RowIsValid(mapped_idx)) {
			continue;
		}

		auto tag_idx = tag_vdata.sel->get_index(sel_p.get_index(row_idx));
		if (!tag_vdata.validity.RowIsValid(tag_idx)) {
			// we can't have NULL tags!
			return UnionInvalidReason::NULL_TAG;
		}
		auto tag = UnifiedVectorFormat::GetData<union_tag_t>(tag_vdata)[tag_idx];
		if (tag >= member_count) {
			return UnionInvalidReason::TAG_OUT_OF_RANGE;
		}

		bool found_valid = false;
		for (idx_t i = 0; i < member_count; i++) {
			auto &member_vdata = child_vdata[1 + i]; // skip the tag
			idx_t member_idx = member_vdata.sel->get_index(sel_p.get_index(row_idx));
			if (!member_vdata.validity.RowIsValid(member_idx)) {
				continue;
			}
			if (found_valid) {
				return UnionInvalidReason::VALIDITY_OVERLAP;
			}
			found_valid = true;
			if (tag != static_cast<union_tag_t>(i)) {
				return UnionInvalidReason::TAG_MISMATCH;
			}
		}
	}

	return UnionInvalidReason::VALID;
}